

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

_Bool Curl_conncache_return_conn(connectdata *conn)

{
  Curl_easy *data_00;
  size_t sVar1;
  ulong local_30;
  connectdata *local_28;
  connectdata *conn_candidate;
  size_t maxconnects;
  Curl_easy *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  if (data_00->multi->maxconnects < 0) {
    local_30 = (ulong)(data_00->multi->num_easy << 2);
  }
  else {
    local_30 = data_00->multi->maxconnects;
  }
  local_28 = (connectdata *)0x0;
  if ((local_30 != 0) && (sVar1 = Curl_conncache_size(data_00), local_30 < sVar1)) {
    Curl_infof(data_00,"Connection cache is full, closing the oldest one.\n");
    local_28 = Curl_conncache_extract_oldest(data_00);
    if (local_28 != (connectdata *)0x0) {
      Curl_disconnect(data_00,local_28,false);
    }
  }
  return local_28 != conn;
}

Assistant:

bool Curl_conncache_return_conn(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;

  /* data->multi->maxconnects can be negative, deal with it. */
  size_t maxconnects =
    (data->multi->maxconnects < 0) ? data->multi->num_easy * 4:
    data->multi->maxconnects;
  struct connectdata *conn_candidate = NULL;

  if(maxconnects > 0 &&
     Curl_conncache_size(data) > maxconnects) {
    infof(data, "Connection cache is full, closing the oldest one.\n");

    conn_candidate = Curl_conncache_extract_oldest(data);
    if(conn_candidate) {
      /* the winner gets the honour of being disconnected */
      (void)Curl_disconnect(data, conn_candidate, /* dead_connection */ FALSE);
    }
  }

  return (conn_candidate == conn) ? FALSE : TRUE;

}